

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar14;
  pointer p;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  m;
  shared_count sStack_450;
  char *local_448;
  char *local_440;
  undefined **local_438;
  undefined1 local_430;
  undefined8 *local_428;
  char **local_420;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_418;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  pool<boost::default_user_allocator_malloc_free> *local_2e0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  local_2d8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>
            ();
  local_2e0 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_2e0->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_2e0->list).ptr = (char *)0x0;
  (local_2e0->list).sz = 0;
  local_2e0->requested_size = 0x18;
  local_2e0->next_size = 0x20;
  local_2e0->start_size = 0x20;
  local_2e0->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
              *)&local_2d8,&local_418,(Column_settings *)local_2e0);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x26d);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
      goto LAB_00133f02;
    }
    if (local_2d8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2d8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00133622;
    }
  }
  goto LAB_00133f02;
joined_r0x00133842:
  if (uVar1 == 3) {
    if (local_2d8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2d8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00133899;
    }
    goto LAB_00133ef6;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
  goto LAB_00133ef6;
  goto joined_r0x00133842;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x00133899:
    if (uVar1 == 1) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_001338cc;
    }
  }
  goto LAB_00133ef6;
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_00133f26;
    if (p_00->rowIndex_ == *(ID_index *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_001338cc:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_001338ff;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_001338ff:
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x270);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
      goto LAB_00133f0e;
    }
    if (local_2d8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2d8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x001339b8;
    }
  }
  goto LAB_00133f0e;
joined_r0x00133c6b:
  if (uVar1 == 3) {
    if (local_2d8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2d8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00133cc2;
    }
    goto LAB_00133f1a;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
  goto LAB_00133f1a;
  goto joined_r0x00133c6b;
joined_r0x00133cc2:
  if (uVar1 == 1) {
    p_Var15 = p_Var2 + 5;
    goto LAB_00133cf5;
  }
  p_Var3 = p_Var3->_M_nxt;
  if ((p_Var3 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
     (uint)((ulong)uVar1 %
           local_2d8.reducedMatrixR_.
           super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
           .indexToRow_._M_h._M_bucket_count) !=
     (uint)(local_2d8.reducedMatrixR_.
            super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
            .indexToRow_._M_h._M_bucket_count != 1))) {
LAB_00133f1a:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x00133cc2;
  while( true ) {
    if (p_Var15 == (_Hash_node_base *)0x0) goto LAB_00133f26;
    if (*(int *)&p_Var15[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00133655:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
  }
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = "!m.is_zero_entry(3, 1)";
  local_440 = "";
  local_430 = 0;
  local_438 = &PTR__lazy_ostream_00239378;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_420 = &local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x26e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
  if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_450.pi_ = (sp_counted_base *)0x0;
        local_448 = "!m.is_zero_column(3)";
        local_440 = "";
        local_430 = 0;
        local_438 = &PTR__lazy_ostream_00239378;
        local_428 = &boost::unit_test::lazy_ostream::inst;
        local_340 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_338 = "";
        local_420 = &local_448;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_450);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
        if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00133ef6;
        p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00133842;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var15 == (_Hash_node_base *)0x0) goto LAB_00133f26;
    if (*(int *)&p_Var15[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_001339eb:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
  }
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = "m.is_zero_entry(3, 1)";
  local_440 = "";
  local_430 = 0;
  local_438 = &PTR__lazy_ostream_00239378;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_420 = &local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x271);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
  if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_450.pi_ = (sp_counted_base *)0x0;
        local_448 = "!m.is_zero_column(3)";
        local_440 = "";
        local_430 = 0;
        local_438 = &PTR__lazy_ostream_00239378;
        local_428 = &boost::unit_test::lazy_ostream::inst;
        local_3a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_398 = "";
        local_420 = &local_448;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_450);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
        if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00133ef6;
        p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00133bd5;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_00133cf5:
  do {
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
    if (p_Var15 == (_Hash_node_base *)0x0) {
LAB_00133f26:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var15[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  sStack_450.pi_ = (sp_counted_base *)0x0;
  local_448 = "m.is_zero_entry(3, 1)";
  local_440 = "";
  local_430 = 0;
  local_438 = &PTR__lazy_ostream_00239378;
  local_428 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_420 = &local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_450);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x274);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar13,0);
  if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_450.pi_ = (sp_counted_base *)0x0;
        local_448 = "m.is_zero_column(3)";
        local_440 = "";
        local_430 = 0;
        local_438 = &PTR__lazy_ostream_00239378;
        local_428 = &boost::unit_test::lazy_ostream::inst;
        local_400 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_3f8 = "";
        local_420 = &local_448;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_450);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
        ::reset(&local_2d8,(Column_settings *)local_2e0);
        ppVar14 = local_2e0;
        if (local_2e0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_2e0);
        }
        operator_delete(ppVar14,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
        ::~RU_matrix(&local_2d8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_418);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x001339b8:
    if (uVar1 == 1) {
      p_Var15 = p_Var2 + 5;
      goto LAB_001339eb;
    }
  }
LAB_00133f0e:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16))) {
joined_r0x00133bd5:
    if (uVar1 == 3) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>::Delete_disposer>
                ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                  *)(p_Var2 + 5),
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                  *)(p_Var2 + 2));
      local_3b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3a8 = "";
      local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x273);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_2d8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
      uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
      if (local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
          (__node_base_ptr)0x0) goto LAB_00133f1a;
      p_Var2 = local_2d8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      goto joined_r0x00133c6b;
    }
  }
LAB_00133ef6:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2d8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2d8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x00133622:
    if (uVar1 == 1) {
      p_Var15 = p_Var2 + 5;
      goto LAB_00133655;
    }
  }
LAB_00133f02:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}